

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O2

void asn1::dumpDER(MemBuffer *mb,int level,int offset)

{
  byte *pbVar1;
  uint64_t uVar2;
  unsigned_short uVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  undefined1 *puVar9;
  char *__s;
  int iVar10;
  ulong uVar11;
  undefined1 local_e8 [8];
  char spaces [70];
  MemBuffer local_80;
  undefined1 local_60 [8];
  MemBuffer mb2;
  
  puVar7 = &DAT_0013f880;
  puVar9 = local_e8;
  for (lVar6 = 0x46; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar9 = puVar9 + 1;
  }
  local_e8[(long)level * 4] = 0;
  mb2.readpos = (uint64_t)(level + 1);
  while (uVar8 = mb->readpos,
        uVar8 < (ulong)((long)(mb->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(mb->data).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
    pVar5 = MemBuffer::readDERHead(mb);
    uVar11 = (ulong)pVar5 >> 0x20;
    uVar2 = mb->readpos;
    iVar10 = pVar5.second;
    MemBuffer::readBuffer((MemBuffer *)local_60,mb,iVar10);
    uVar4 = pVar5.first;
    printf("%04x : %s%02x %04x : ",(ulong)(uint)((int)uVar8 + offset),local_e8,
           (ulong)pVar5 & 0xffffffff,uVar11);
    if ((uVar4 & 0xfffffffb) == 0x13) {
      MemBuffer::readString_abi_cxx11_((string *)(spaces + 0x40),(MemBuffer *)local_60,iVar10);
      printf("\"%s\" \n",stack0xffffffffffffff60);
      std::__cxx11::string::~string((string *)(spaces + 0x40));
    }
    else if ((uVar4 - 3 < 2) || (uVar4 == 6)) {
      if (iVar10 == 0 || (long)pVar5 < 0) {
        uVar11 = 0;
      }
      while (iVar10 = (int)uVar11, uVar11 = (ulong)(iVar10 - 1), iVar10 != 0) {
        pbVar1 = (byte *)((long)local_60 +
                         (long)mb2.data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 1;
        printf("%02x ",(ulong)*pbVar1);
      }
      putchar(10);
    }
    else if (uVar4 == 2) {
      if (iVar10 == 4) {
        uVar4 = MemBuffer::read<unsigned_int>((MemBuffer *)local_60);
        uVar8 = (ulong)uVar4;
      }
      else if (iVar10 == 2) {
        uVar3 = MemBuffer::read<unsigned_short>((MemBuffer *)local_60);
        uVar8 = (ulong)uVar3;
      }
      else {
        uVar8 = 0;
        if (iVar10 == 1) {
          uVar8 = (ulong)*(byte *)((long)local_60 +
                                  (long)mb2.data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
        }
      }
      printf("%x\n",uVar8);
    }
    else if ((int)uVar4 < 0x30) {
      if (uVar4 == 5) {
        __s = "NULL";
      }
      else {
        __s = "<data>";
      }
      puts(__s);
    }
    else {
      putchar(10);
      MemBuffer::MemBuffer(&local_80,(MemBuffer *)local_60);
      dumpDER(&local_80,(int)mb2.readpos,(int)uVar2);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  }
  return;
}

Assistant:

void dumpDER(MemBuffer mb, int level, int offset)
{
    char spaces[] =
        "                                                                     ";
    spaces[level * 4] = 0;
    while (!mb.done()) {
        unsigned int offs = mb.pos() + offset;
        auto p = mb.readDERHead();
        int o = mb.pos();
        MemBuffer mb2 = mb.readBuffer(p.second);
        printf("%04x : %s%02x %04x : ", offs, spaces, p.first, p.second);

        if (p.first == 0x13 || p.first == 0x17) {
            printf("\"%s\" \n", mb2.readString(p.second).c_str());
        } else if (p.first == 0x02) {
            unsigned v = 0;
            switch (p.second) {
            case 1:
                v = mb2.read<uint8_t>();
                break;
            case 2:
                v = mb2.read<uint16_t>();
                break;
            case 4:
                v = mb2.read<uint32_t>();
                break;
            }
            printf("%x\n", v);
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
            for (int i = 0; i < p.second; i++)
                printf("%02x ", mb2.read<uint8_t>());
            printf("\n");
        } else if (p.first >= 0x30) {
            printf("\n");
            dumpDER(mb2, level + 1, o);
        } else if (p.first == 5)
            printf("NULL\n");
        else
            printf("<data>\n");
    }
}